

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::LowerGetNewScObjectCommon
          (Lowerer *this,RegOpnd *resultObjOpnd,RegOpnd *constructorReturnOpnd,RegOpnd *newObjOpnd,
          Instr *insertBeforeInstr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LabelInstr *labelHelper;
  LabelInstr *branchTarget;
  BranchInstr *instr;
  
  if (resultObjOpnd == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x13c1,"(resultObjOpnd)","resultObjOpnd");
    if (!bVar2) goto LAB_005c5320;
    *puVar3 = 0;
  }
  if (constructorReturnOpnd == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x13c2,"(constructorReturnOpnd)","constructorReturnOpnd");
    if (!bVar2) goto LAB_005c5320;
    *puVar3 = 0;
  }
  if (newObjOpnd == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x13c3,"(newObjOpnd)","newObjOpnd");
    if (!bVar2) goto LAB_005c5320;
    *puVar3 = 0;
  }
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x13c4,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar2) goto LAB_005c5320;
    *puVar3 = 0;
  }
  bVar2 = IR::Opnd::IsEqual(&constructorReturnOpnd->super_Opnd,&newObjOpnd->super_Opnd);
  if (!bVar2) {
    labelHelper = IR::LabelInstr::New(Label,this->m_func,false);
    if (insertBeforeInstr->m_prev == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x13d3,"(insertBeforeInstr->m_prev)","insertBeforeInstr->m_prev");
      if (!bVar2) {
LAB_005c5320:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
    IR::Instr::InsertBefore(insertBeforeInstr,&branchTarget->super_Instr);
    LowererMD::GenerateIsJsObjectTest
              (&this->m_lowererMD,constructorReturnOpnd,&branchTarget->super_Instr,labelHelper);
    bVar2 = IR::Opnd::IsEqual(&resultObjOpnd->super_Opnd,&constructorReturnOpnd->super_Opnd);
    if (!bVar2) {
      InsertMove(&resultObjOpnd->super_Opnd,&constructorReturnOpnd->super_Opnd,
                 &branchTarget->super_Instr,true);
    }
    instr = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
    IR::Instr::InsertBefore(&branchTarget->super_Instr,&instr->super_Instr);
    IR::Instr::InsertBefore(&branchTarget->super_Instr,&labelHelper->super_Instr);
    insertBeforeInstr = &branchTarget->super_Instr;
  }
  bVar2 = IR::Opnd::IsEqual(&resultObjOpnd->super_Opnd,&newObjOpnd->super_Opnd);
  if (!bVar2) {
    InsertMove(&resultObjOpnd->super_Opnd,&newObjOpnd->super_Opnd,insertBeforeInstr,true);
    return;
  }
  return;
}

Assistant:

void
Lowerer::LowerGetNewScObjectCommon(
    IR::RegOpnd *const resultObjOpnd,
    IR::RegOpnd *const constructorReturnOpnd,
    IR::RegOpnd *const newObjOpnd,
    IR::Instr *insertBeforeInstr)
{
    Assert(resultObjOpnd);
    Assert(constructorReturnOpnd);
    Assert(newObjOpnd);
    Assert(insertBeforeInstr);

    // (newObjOpnd == 'this' value passed to constructor)
    //
    // if (!IsJsObject(constructorReturnOpnd))
    //     goto notObjectLabel
    // newObjOpnd = constructorReturnOpnd
    // notObjectLabel:
    // resultObjOpnd = newObjOpnd

    if(!constructorReturnOpnd->IsEqual(newObjOpnd))
    {
        // Need to check whether the constructor returned an object

        IR::LabelInstr *notObjectLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
        Assert(insertBeforeInstr->m_prev);
        IR::LabelInstr *const doneLabel =  IR::LabelInstr::New(Js::OpCode::Label, m_func);
        insertBeforeInstr->InsertBefore(doneLabel);
        insertBeforeInstr = doneLabel;

#if defined(_M_ARM32_OR_ARM64)
        m_lowererMD.LoadHelperArgument(insertBeforeInstr, constructorReturnOpnd);

        IR::Opnd * targetOpnd = IR::RegOpnd::New(StackSym::New(TyInt32,m_func), TyInt32, m_func);
        IR::Instr * callIsObjectInstr = IR::Instr::New(Js::OpCode::Call, targetOpnd, m_func);
        insertBeforeInstr->InsertBefore(callIsObjectInstr);
        this->m_lowererMD.ChangeToHelperCall(callIsObjectInstr, IR::HelperOp_IsObject);

        InsertTestBranch( targetOpnd, targetOpnd, Js::OpCode::BrEq_A, notObjectLabel,insertBeforeInstr);
#else
        m_lowererMD.GenerateIsJsObjectTest(constructorReturnOpnd, insertBeforeInstr, notObjectLabel);
#endif

        // Value returned by constructor is an object (use constructorReturnOpnd)
        if(!resultObjOpnd->IsEqual(constructorReturnOpnd))
        {
            this->InsertMove(resultObjOpnd, constructorReturnOpnd, insertBeforeInstr);
        }
        insertBeforeInstr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, doneLabel, m_func));

        // Value returned by constructor is not an object (use newObjOpnd)
        insertBeforeInstr->InsertBefore(notObjectLabel);
    }

    if(!resultObjOpnd->IsEqual(newObjOpnd))
    {
        this->InsertMove(resultObjOpnd, newObjOpnd, insertBeforeInstr);
    }

    // fall through to insertBeforeInstr or doneLabel
}